

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O3

bool __thiscall OSToken::getSOPIN(OSToken *this,ByteString *soPINBlob)

{
  int iVar1;
  ByteString *in;
  OSAttribute local_b0;
  
  if (((this->valid == true) &&
      (iVar1 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[10])(), (char)iVar1 != '\0')) &&
     (iVar1 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[2])(this->tokenObject,0x8000534c)
     , (char)iVar1 != '\0')) {
    (*(this->tokenObject->super_OSObject)._vptr_OSObject[3])(&local_b0,this->tokenObject,0x8000534c)
    ;
    in = OSAttribute::getByteStringValue(&local_b0);
    ByteString::operator=(soPINBlob,in);
    OSAttribute::~OSAttribute(&local_b0);
    return true;
  }
  return false;
}

Assistant:

bool OSToken::getSOPIN(ByteString& soPINBlob)
{
	if (!valid || !tokenObject->isValid())
	{
		return false;
	}

	if (tokenObject->attributeExists(CKA_OS_SOPIN))
	{
		soPINBlob = tokenObject->getAttribute(CKA_OS_SOPIN).getByteStringValue();

		return true;
	}
	else
	{
		return false;
	}
}